

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_Font::SetFamilyName(ON_Font *this,wchar_t *family_name)

{
  bool bVar1;
  wchar_t *string1;
  wchar_t *string2;
  undefined1 local_40 [24];
  undefined1 local_28 [8];
  ON_wString local_family_name;
  wchar_t *family_name_local;
  ON_Font *this_local;
  
  local_family_name.m_s = family_name;
  FamilyNameFromDirtyName((ON_Font *)local_28,family_name);
  ON_wString::TrimLeftAndRight((ON_wString *)local_28,(wchar_t *)0x0);
  string1 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_28);
  local_family_name.m_s = string1;
  FamilyName((ON_Font *)local_40);
  string2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_40);
  bVar1 = ON_wString::EqualOrdinal(string1,string2,false);
  ON_wString::~ON_wString((ON_wString *)local_40);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ModificationPermitted
                      (this,"",
                       "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                       ,0x2d08);
    if (bVar1) {
      Internal_ClearName(this,true,true,true,true);
      this->m_logfont_charset = '\x01';
      ON_wString::operator=(&this->m_loc_family_name,local_family_name.m_s);
      ON_wString::operator=(&this->m_en_family_name,&this->m_loc_family_name);
      Internal_AfterModification(this);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  ON_wString::~ON_wString((ON_wString *)local_28);
  return this_local._7_1_;
}

Assistant:

bool ON_Font::SetFamilyName(
  const wchar_t* family_name
)
{
  ON_wString local_family_name = ON_Font::FamilyNameFromDirtyName(family_name);
  local_family_name.TrimLeftAndRight();
  family_name = local_family_name;

  if ( ON_wString::EqualOrdinal(family_name, FamilyName(), false) )
  {
    return true;
  }

  if ( false == ON_FONT_MODIFICATION_PERMITTED )
    return false;  
  
  Internal_ClearName(true, true, true, true);
  
  m_logfont_charset = ON_Font::WindowsConstants::logfont_default_charset;

  m_loc_family_name = family_name;  
  m_en_family_name = m_loc_family_name;  

  Internal_AfterModification();
  return true;
}